

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

bool anon_unknown.dwarf_625c4::cmRemoveDirectory(string *dir,bool recursive)

{
  bool bVar1;
  Status SVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  
  bVar1 = cmsys::SystemTools::FileIsSymlink(dir);
  if (bVar1) {
    SVar2 = cmsys::SystemTools::RemoveFile(dir);
    if (SVar2.Kind_ == Success) {
      return true;
    }
    pcVar5 = "Error removing directory symlink \"";
    lVar4 = 0x22;
  }
  else {
    if (!recursive) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error removing directory \"",0x1a);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(dir->_M_dataplus)._M_p,dir->_M_string_length);
      pcVar5 = "\" without recursive option.\n";
      lVar4 = 0x1c;
      goto LAB_0019b550;
    }
    SVar2 = cmsys::SystemTools::RemoveADirectory(dir);
    if (SVar2.Kind_ == Success) {
      return true;
    }
    pcVar5 = "Error removing directory \"";
    lVar4 = 0x1a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(dir->_M_dataplus)._M_p,dir->_M_string_length);
  pcVar5 = "\".\n";
  lVar4 = 3;
LAB_0019b550:
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  return false;
}

Assistant:

bool cmRemoveDirectory(const std::string& dir, bool recursive = true)
{
  if (cmSystemTools::FileIsSymlink(dir)) {
    if (!cmSystemTools::RemoveFile(dir)) {
      std::cerr << "Error removing directory symlink \"" << dir << "\".\n";
      return false;
    }
  } else if (!recursive) {
    std::cerr << "Error removing directory \"" << dir
              << "\" without recursive option.\n";
    return false;
  } else if (!cmSystemTools::RemoveADirectory(dir)) {
    std::cerr << "Error removing directory \"" << dir << "\".\n";
    return false;
  }
  return true;
}